

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::DecodePsbtResponse::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse> *in_stack_fffffffffffff988;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse> *in_stack_fffffffffffff990;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse> *this;
  char (*in_stack_fffffffffffff998) [8];
  char (*__args) [4];
  function<void_(cfd::api::json::DecodePsbtResponse_&,_const_UniValue_&)> *in_stack_fffffffffffff9a0
  ;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse> local_529;
  allocator local_491;
  value_type local_490;
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_3f9;
  value_type local_3f8;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_361;
  value_type local_360;
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  value_type local_2c8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  value_type local_230;
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                   *)0x6ae323);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[3],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,(char (*) [3])in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"tx",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,(char (*) [7])in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"tx_hex",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,(char (*) [6])in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"xpubs",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"version",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,"unknown",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,(char (*) [7])in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_3d8 = (_Base_ptr)pVar2.first._M_node;
    local_3d0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"inputs",&local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)in_stack_fffffffffffff998);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,
               (_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)in_stack_fffffffffffff998);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff998);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                        *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                       in_stack_fffffffffffff990);
    local_470 = (_Base_ptr)pVar2.first._M_node;
    local_468 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"outputs",&local_491);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    __args = (char (*) [4])((long)&local_529.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::DecodePsbtResponse_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::DecodePsbtResponse_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtResponse_&)>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_DecodePsbtResponse_ptr
                *)__args);
    std::function<void(cfd::api::json::DecodePsbtResponse&,UniValue_const&)>::
    function<void(&)(cfd::api::json::DecodePsbtResponse&,UniValue_const&),void>
              (in_stack_fffffffffffff9a0,(_func_void_DecodePsbtResponse_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff9a0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::operator=
              (in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffff990);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>>>>
            ::
            emplace<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>&>
                      (this_00,__args,in_stack_fffffffffffff990);
    local_529.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_529.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_529;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_529.get_function.super__Function_base._M_functor._M_pod_data + 1),"fee",
               (allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_529.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_529.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>::~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void DecodePsbtResponse::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<DecodePsbtResponse> func_table;  // NOLINT

  func_table = {
    DecodePsbtResponse::GetTxString,
    DecodePsbtResponse::SetTxString,
    DecodePsbtResponse::GetTxFieldType,
  };
  json_mapper.emplace("tx", func_table);
  item_list.push_back("tx");
  func_table = {
    DecodePsbtResponse::GetTx_hexString,
    DecodePsbtResponse::SetTx_hexString,
    DecodePsbtResponse::GetTx_hexFieldType,
  };
  json_mapper.emplace("tx_hex", func_table);
  item_list.push_back("tx_hex");
  func_table = {
    DecodePsbtResponse::GetXpubsString,
    DecodePsbtResponse::SetXpubsString,
    DecodePsbtResponse::GetXpubsFieldType,
  };
  json_mapper.emplace("xpubs", func_table);
  item_list.push_back("xpubs");
  func_table = {
    DecodePsbtResponse::GetVersionString,
    DecodePsbtResponse::SetVersionString,
    DecodePsbtResponse::GetVersionFieldType,
  };
  json_mapper.emplace("version", func_table);
  item_list.push_back("version");
  func_table = {
    DecodePsbtResponse::GetUnknownString,
    DecodePsbtResponse::SetUnknownString,
    DecodePsbtResponse::GetUnknownFieldType,
  };
  json_mapper.emplace("unknown", func_table);
  item_list.push_back("unknown");
  func_table = {
    DecodePsbtResponse::GetInputsString,
    DecodePsbtResponse::SetInputsString,
    DecodePsbtResponse::GetInputsFieldType,
  };
  json_mapper.emplace("inputs", func_table);
  item_list.push_back("inputs");
  func_table = {
    DecodePsbtResponse::GetOutputsString,
    DecodePsbtResponse::SetOutputsString,
    DecodePsbtResponse::GetOutputsFieldType,
  };
  json_mapper.emplace("outputs", func_table);
  item_list.push_back("outputs");
  func_table = {
    DecodePsbtResponse::GetFeeString,
    DecodePsbtResponse::SetFeeString,
    DecodePsbtResponse::GetFeeFieldType,
  };
  json_mapper.emplace("fee", func_table);
  item_list.push_back("fee");
}